

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::loadensemblemapping(aalcalc *this)

{
  int *piVar1;
  pointer piVar2;
  int *piVar3;
  FILE *__stream;
  pointer piVar4;
  size_t sVar5;
  int *piVar6;
  Ensemble e;
  value_type_conflict local_2c;
  
  __stream = fopen("input/ensemble.bin","rb");
  if (__stream != (FILE *)0x0) {
    if (this->ord_output_ == true) {
      fwrite("WARNING: ensembles not compatible with ORD format. Ignoring ensemble file.\n",0x4b,1,
             _stderr);
      return;
    }
    e.sidx = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->sidxtoensemble_,(long)this->samplesize_ + 1,&e.sidx);
    piVar2 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar4 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
      *piVar4 = 0;
    }
    while( true ) {
      sVar5 = fread(&e,8,1,__stream);
      if (sVar5 == 0) break;
      (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[e.sidx] = e.ensemble_id;
      if (this->max_ensemble_id_ < e.ensemble_id) {
        this->max_ensemble_id_ = e.ensemble_id;
      }
    }
    local_2c = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->ensemblecount_,(long)this->max_ensemble_id_ + 1,&local_2c);
    piVar6 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar4 = (this->ensemblecount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (piVar6 = piVar6 + 1, piVar6 != piVar3) {
      if ((long)*piVar6 == 0) {
        fwrite("FATAL: All sidx must have associated ensemble IDs\n",0x32,1,_stderr);
        exit(-1);
      }
      piVar1 = piVar4 + *piVar6;
      *piVar1 = *piVar1 + 1;
    }
  }
  return;
}

Assistant:

void aalcalc::loadensemblemapping()
{
	FILE *fin = fopen(ENSEMBLE_FILE, "rb");
	if (fin == NULL) return;
	if (ord_output_ == true) {
		fprintf(stderr, "WARNING: ensembles not compatible with ORD format. Ignoring ensemble file.\n");
		return;
	}

	Ensemble e;
	sidxtoensemble_.resize(samplesize_ + 1, 0);
	std::fill(sidxtoensemble_.begin(), sidxtoensemble_.end(), 0);
	size_t i = fread(&e, sizeof(Ensemble), 1, fin);
	while (i != 0) {
		sidxtoensemble_[e.sidx] = e.ensemble_id;
		if (e.ensemble_id > max_ensemble_id_) {
			max_ensemble_id_ = e.ensemble_id;
		}

		i = fread(&e, sizeof(Ensemble), 1, fin);

	}

	// Check all sidx have ensemble IDs
	// Count how many sidx are associated with each ensemble ID
	ensemblecount_.resize(max_ensemble_id_ + 1, 0);
	for (std::vector<int>::const_iterator it = std::next(sidxtoensemble_.begin());
	     it != sidxtoensemble_.end(); it++) {
		if (*it == 0) {
			fprintf(stderr, "FATAL: All sidx must have associated ensemble IDs\n");
			exit(-1);
		}
		ensemblecount_[*it]++;
	}

}